

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.h
# Opt level: O0

uint32_t BS::weight_gen(vw *all)

{
  uint64_t *in_RDI;
  float fVar1;
  float temp;
  undefined4 local_4;
  
  fVar1 = merand48(in_RDI);
  if (0.36787945 < fVar1) {
    if (0.7357589 < fVar1) {
      if (0.9196986 < fVar1) {
        if (0.98101187 < fVar1) {
          if (0.99634016 < fVar1) {
            if (0.9994058 < fVar1) {
              if (0.99991673 < fVar1) {
                if (0.99998975 < fVar1) {
                  if (0.99999887 < fVar1) {
                    if (0.9999999 < fVar1) {
                      if (1.0 < fVar1) {
                        if (1.0 < fVar1) {
                          if (1.0 < fVar1) {
                            if (1.0 < fVar1) {
                              if (1.0 < fVar1) {
                                if (1.0 < fVar1) {
                                  if (1.0 < fVar1) {
                                    if (1.0 < fVar1) {
                                      if (1.0 < fVar1) {
                                        if (1.0 < fVar1) {
                                          local_4 = 0x14;
                                        }
                                        else {
                                          local_4 = 0x13;
                                        }
                                      }
                                      else {
                                        local_4 = 0x12;
                                      }
                                    }
                                    else {
                                      local_4 = 0x11;
                                    }
                                  }
                                  else {
                                    local_4 = 0x10;
                                  }
                                }
                                else {
                                  local_4 = 0xf;
                                }
                              }
                              else {
                                local_4 = 0xe;
                              }
                            }
                            else {
                              local_4 = 0xd;
                            }
                          }
                          else {
                            local_4 = 0xc;
                          }
                        }
                        else {
                          local_4 = 0xb;
                        }
                      }
                      else {
                        local_4 = 10;
                      }
                    }
                    else {
                      local_4 = 9;
                    }
                  }
                  else {
                    local_4 = 8;
                  }
                }
                else {
                  local_4 = 7;
                }
              }
              else {
                local_4 = 6;
              }
            }
            else {
              local_4 = 5;
            }
          }
          else {
            local_4 = 4;
          }
        }
        else {
          local_4 = 3;
        }
      }
      else {
        local_4 = 2;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline uint32_t weight_gen(vw& all)  // sampling from Poisson with rate 1
{
  float temp = merand48(all.random_state);
  if (temp <= 0.3678794411714423215955)
    return 0;
  if (temp <= 0.735758882342884643191)
    return 1;
  if (temp <= 0.919698602928605803989)
    return 2;
  if (temp <= 0.9810118431238461909214)
    return 3;
  if (temp <= 0.9963401531726562876545)
    return 4;
  if (temp <= 0.9994058151824183070012)
    return 5;
  if (temp <= 0.9999167588507119768923)
    return 6;
  if (temp <= 0.9999897508033253583053)
    return 7;
  if (temp <= 0.9999988747974020309819)
    return 8;
  if (temp <= 0.9999998885745216612793)
    return 9;
  if (temp <= 0.9999999899522336243091)
    return 10;
  if (temp <= 0.9999999991683892573118)
    return 11;
  if (temp <= 0.9999999999364022267287)
    return 12;
  if (temp <= 0.999999999995480147453)
    return 13;
  if (temp <= 0.9999999999996999989333)
    return 14;
  if (temp <= 0.9999999999999813223654)
    return 15;
  if (temp <= 0.9999999999999989050799)
    return 16;
  if (temp <= 0.9999999999999999393572)
    return 17;
  if (temp <= 0.999999999999999996817)
    return 18;
  if (temp <= 0.9999999999999999998412)
    return 19;
  return 20;
}